

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChebTools.cpp
# Opt level: O2

vector<ChebTools::ChebyshevExpansion,_std::allocator<ChebTools::ChebyshevExpansion>_> * __thiscall
ChebTools::ChebyshevExpansion::subdivide
          (vector<ChebTools::ChebyshevExpansion,_std::allocator<ChebTools::ChebyshevExpansion>_>
           *__return_storage_ptr__,ChebyshevExpansion *this,size_t Nintervals,size_t Norder)

{
  ulong uVar1;
  ulong uVar2;
  long lVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  VectorXd *local_270;
  double local_268;
  double dStack_260;
  longdouble local_258;
  size_t local_240;
  long local_238;
  double local_230;
  double local_228;
  VectorXd xpts_n11;
  double NN;
  double local_208;
  double dStack_200;
  double local_1f8;
  double dStack_1f0;
  VectorXd xrealworld;
  CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::linspaced_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  local_1b0;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::linspaced_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  local_128;
  CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,__1,_1,_0,__1,_1>_>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,__1,_1,_0,__1,_1>_>_>
  local_c8;
  double local_48;
  
  if (Nintervals == 1) {
    std::vector<ChebTools::ChebyshevExpansion,_std::allocator<ChebTools::ChebyshevExpansion>_>::
    vector(__return_storage_ptr__,1,this,(allocator_type *)&local_c8);
  }
  else {
    (__return_storage_ptr__->
    super__Vector_base<ChebTools::ChebyshevExpansion,_std::allocator<ChebTools::ChebyshevExpansion>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<ChebTools::ChebyshevExpansion,_std::allocator<ChebTools::ChebyshevExpansion>_>
    )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<ChebTools::ChebyshevExpansion,_std::allocator<ChebTools::ChebyshevExpansion>_>
    )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_268 = this->m_xmax - this->m_xmin;
    dStack_260 = 0.0;
    auVar4._8_4_ = (int)(Norder >> 0x20);
    auVar4._0_8_ = Norder;
    auVar4._12_4_ = 0x45300000;
    NN = (auVar4._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)Norder) - 4503599627370496.0);
    local_270 = (VectorXd *)0x0;
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::LinSpaced
              ((RandomAccessLinSpacedReturnType *)&xrealworld,Norder + 1,(Scalar *)&local_270,&NN);
    local_258 = _DAT_00135620;
    local_240 = Norder;
    Eigen::
    MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::linspaced_op<double>,Eigen::Matrix<double,-1,1,0,-1,1>>>
    ::operator*(&local_128,
                (MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::linspaced_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>
                 *)&xrealworld,&local_258);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::linspaced_op<double>,Eigen::Matrix<double,-1,1,0,-1,1>>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,-1,1,0,-1,1>const>const>>
    ::operator/(&local_1b0,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::linspaced_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const>>
                 *)&local_128,&NN);
    local_c8.m_lhs.m_lhs.m_lhs.m_rows.m_value = local_1b0.m_lhs.m_lhs.m_rows.m_value;
    local_c8.m_lhs.m_lhs.m_lhs._8_8_ = local_1b0.m_lhs.m_lhs._8_8_;
    local_c8.m_lhs.m_lhs.m_lhs.m_functor.m_other = local_1b0.m_lhs.m_lhs.m_functor.impl.m_low;
    local_c8.m_lhs.m_lhs.m_rhs.m_expression =
         (NestedExpressionType)local_1b0.m_lhs.m_lhs.m_functor.impl.m_high;
    local_c8.m_lhs.m_lhs._40_8_ = local_1b0.m_lhs.m_lhs.m_functor.impl.m_size1;
    local_c8.m_lhs.m_rhs.m_rows.m_value = (long)local_1b0.m_lhs.m_lhs.m_functor.impl.m_step;
    local_c8.m_lhs.m_rhs._8_1_ = local_1b0.m_lhs.m_lhs.m_functor.impl.m_flip;
    local_c8.m_lhs.m_rhs._9_7_ = local_1b0.m_lhs.m_lhs.m_functor.impl._33_7_;
    local_c8.m_lhs.m_rhs.m_functor.m_other = (double)local_1b0.m_lhs.m_rhs.m_rows.m_value;
    local_c8.m_rhs.m_rows.m_value = (long)local_1b0.m_lhs.m_rhs.m_functor.m_other;
    local_c8.m_rhs.m_functor.m_other = (double)local_1b0.m_rhs.m_rows.m_value;
    local_48 = local_1b0.m_rhs.m_functor.m_other;
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
    PlainObjectBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_cos_op<double>,Eigen::ArrayWrapper<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::linspaced_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const>const>const>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&xpts_n11,
               (DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_cos_op<double>,_const_Eigen::ArrayWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::linspaced_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>_>_>
                *)&local_c8);
    lVar3 = Nintervals - 1;
    auVar5._8_4_ = (int)((ulong)lVar3 >> 0x20);
    auVar5._0_8_ = lVar3;
    auVar5._12_4_ = 0x45300000;
    local_268 = local_268 /
                ((auVar5._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)lVar3) - 4503599627370496.0));
    uVar1 = 0;
    dStack_260 = local_268;
    while( true ) {
      if (lVar3 == 0) break;
      uVar2 = uVar1 + 1;
      local_1f8 = this->m_xmin +
                  (((double)(uVar2 >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25) +
                  (double)(uVar2 & 0xffffffff | 0x4330000000000000)) * local_268;
      local_208 = this->m_xmin +
                  (((double)(uVar1 >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25) +
                  (double)(uVar1 & 0xffffffff | 0x4330000000000000)) * dStack_260;
      local_258 = (longdouble)CONCAT28(local_258._8_2_,local_1f8 - local_208);
      local_270 = &xpts_n11;
      local_238 = lVar3 + -1;
      dStack_200 = local_208;
      dStack_1f0 = local_208;
      Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,__1,_1,_0,__1,_1>_>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                        *)&local_128,(double *)&local_258,(StorageBaseType *)&local_270);
      local_228 = local_1f8 + local_208;
      Eigen::
      ArrayBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,-1,1,0,-1,1>const>const,Eigen::ArrayWrapper<Eigen::Matrix<double,-1,1,0,-1,1>>const>>
      ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,__1,_1,_0,__1,_1>_>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,__1,_1,_0,__1,_1>_>_>
                   *)&local_1b0,
                  (ArrayBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,_1,1,0,_1,1>const>const,Eigen::ArrayWrapper<Eigen::Matrix<double,_1,1,0,_1,1>>const>>
                   *)&local_128,&local_228);
      local_230 = 2.0;
      Eigen::
      ArrayBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,-1,1,0,-1,1>const>const,Eigen::ArrayWrapper<Eigen::Matrix<double,-1,1,0,-1,1>>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,-1,1,0,-1,1>const>const>>
      ::operator/(&local_c8,
                  (ArrayBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,_1,1,0,_1,1>const>const,Eigen::ArrayWrapper<Eigen::Matrix<double,_1,1,0,_1,1>>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,_1,1,0,_1,1>const>const>>
                   *)&local_1b0,&local_230);
      Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
      PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,_1,1,0,_1,1>const>const,Eigen::ArrayWrapper<Eigen::Matrix<double,_1,1,0,_1,1>>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,_1,1,0,_1,1>const>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,_1,1,0,_1,1>const>const>>
                ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&xrealworld,
                 (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,__1,_1,_0,__1,_1>_>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,__1,_1,_0,__1,_1>_>_>_>
                  *)&local_c8);
      y((ChebyshevExpansion *)&local_1b0,&this->m_c);
      lVar3 = local_238;
      factoryf((ChebyshevExpansion *)&local_c8,local_240,(VectorXd *)&local_1b0,local_208,local_1f8)
      ;
      std::vector<ChebTools::ChebyshevExpansion,_std::allocator<ChebTools::ChebyshevExpansion>_>::
      emplace_back<ChebTools::ChebyshevExpansion>
                (__return_storage_ptr__,(ChebyshevExpansion *)&local_c8);
      ~ChebyshevExpansion((ChebyshevExpansion *)&local_c8);
      free((void *)local_1b0._0_8_);
      free(xrealworld.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
           m_data);
      uVar1 = uVar2;
    }
    free(xpts_n11.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<ChebyshevExpansion> ChebyshevExpansion::subdivide(std::size_t Nintervals, const std::size_t Norder) const {

        if (Nintervals == 1) {
            return std::vector<ChebyshevExpansion>(1, *this);
        }

        std::vector<ChebyshevExpansion> segments;
        double deltax = (m_xmax - m_xmin) / (Nintervals - 1);

        // Vector of values in the range [-1,1] as roots of a high-order Chebyshev
        double NN = static_cast<double>(Norder);
        Eigen::VectorXd xpts_n11 = (Eigen::VectorXd::LinSpaced(Norder + 1, 0, NN)*EIGEN_PI/NN).array().cos();

        for (std::size_t i = 0; i < Nintervals - 1; ++i) {
            double xmin = m_xmin + i*deltax, xmax = m_xmin + (i + 1)*deltax;
            Eigen::VectorXd xrealworld = ((xmax - xmin)*xpts_n11.array() + (xmax + xmin)) / 2.0;
            segments.push_back(factoryf(Norder, y(xrealworld), xmin, xmax));
        }
        return segments;
    }